

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquery.cc
# Opt level: O3

bool __thiscall bdQuery::proxies(bdQuery *this,list<bdId,_std::allocator<bdId>_> *answer)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  
  p_Var2 = (this->mProxiesFlagged).super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl._M_node
           .super__List_node_base._M_next;
  for (p_Var3 = p_Var2; p_Var3 != (_List_node_base *)&this->mProxiesFlagged;
      p_Var3 = p_Var3->_M_next) {
    p_Var7 = (_List_node_base *)operator_new(0x38);
    p_Var4 = p_Var3[1]._M_prev;
    p_Var5 = p_Var3[2]._M_next;
    p_Var6 = p_Var3[2]._M_prev;
    p_Var7[1]._M_next = p_Var3[1]._M_next;
    p_Var7[1]._M_prev = p_Var4;
    p_Var7[2]._M_next = p_Var5;
    p_Var7[2]._M_prev = p_Var6;
    *(undefined4 *)&p_Var7[3]._M_next = *(undefined4 *)&p_Var3[3]._M_next;
    std::__detail::_List_node_base::_M_hook(p_Var7);
    psVar1 = &(answer->super__List_base<bdId,_std::allocator<bdId>_>)._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  return p_Var2 != (_List_node_base *)&this->mProxiesFlagged;
}

Assistant:

bool bdQuery::proxies(std::list<bdId> &answer) {
	/* get all the matches to our query */
    std::list<bdPeer>::iterator it;
	int i = 0;
	for (it = mProxiesFlagged.begin(); it != mProxiesFlagged.end(); it++, i++)
		answer.push_back(it->mPeerId);
	return (i > 0);
}